

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrPlaneDetectorPolygonBufferEXT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrStructureType __val;
  uint uVar6;
  bool bVar7;
  char *pcVar8;
  XrInstance pXVar9;
  invalid_argument *this;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint __len;
  string type_prefix;
  string next_prefix;
  string vertices_prefix;
  string vertexcountoutput_prefix;
  string vertexcapacityinput_prefix;
  ostringstream oss_vertexCapacityInput;
  ostringstream oss_vertexCountOutput;
  ostringstream oss_vertices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  long *local_558;
  long local_550;
  long local_548 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ios_base local_428 [264];
  undefined1 local_320 [24];
  uint auStack_308 [22];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  paVar1 = &local_498.field_2;
  local_498._M_dataplus._M_p = (pointer)paVar1;
  local_320._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_498,'\x12');
  *local_498._M_dataplus._M_p = '0';
  local_498._M_dataplus._M_p[1] = 'x';
  pcVar8 = local_498._M_dataplus._M_p + (local_498._M_string_length - 1);
  lVar11 = 0;
  do {
    bVar2 = local_320[lVar11];
    *pcVar8 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar8[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar11 = lVar11 + 1;
    pcVar8 = pcVar8 + -2;
  } while (lVar11 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != paVar1) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_578,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_578);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    __len = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar12 = (ulong)__val;
      uVar6 = 4;
      do {
        __len = uVar6;
        uVar10 = (uint)uVar12;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_00205f26;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_00205f26;
        }
        if (uVar10 < 10000) goto LAB_00205f26;
        uVar12 = uVar12 / 10000;
        uVar6 = __len + 4;
      } while (99999 < uVar10);
      __len = __len + 1;
    }
LAB_00205f26:
    local_498._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_498,(char)__len - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_498._M_dataplus._M_p + (XVar3 >> 0x1f),__len,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_578,&local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_498.field_2._M_allocated_capacity = 0;
    local_498.field_2._8_8_ = 0;
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar9 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar9,value->type,(char *)&local_498);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_578,(char (*) [64])&local_498);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_558 = local_548;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_558,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_558);
  value_00 = value->next;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,local_558,local_550 + (long)local_558);
  bVar7 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4d8,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4f8,pcVar4,pcVar4 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_4f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"0x",2);
    *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_498);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_4f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
    if ((XrPlaneDetectorPolygonBufferEXT *)local_320._0_8_ !=
        (XrPlaneDetectorPolygonBufferEXT *)(local_320 + 0x10)) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_518,pcVar4,pcVar4 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_518);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
    *(uint *)((long)auStack_308 + (long)*(void **)(local_320._0_8_ + -0x18)) =
         *(uint *)((long)auStack_308 + (long)*(void **)(local_320._0_8_ + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_320);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_518,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_538,pcVar4,pcVar4 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_538);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_1a8[0].field_2 +
                  *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_1a8);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"XrVector2f*",&local_538,&local_4b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
    std::ios_base::~ios_base(local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if (local_558 != local_548) {
      operator_delete(local_558,local_548[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPlaneDetectorPolygonBufferEXT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string vertexcapacityinput_prefix = prefix;
        vertexcapacityinput_prefix += "vertexCapacityInput";
        std::ostringstream oss_vertexCapacityInput;
        oss_vertexCapacityInput << "0x" << std::hex << (value->vertexCapacityInput);
        contents.emplace_back("uint32_t", vertexcapacityinput_prefix, oss_vertexCapacityInput.str());
        std::string vertexcountoutput_prefix = prefix;
        vertexcountoutput_prefix += "vertexCountOutput";
        std::ostringstream oss_vertexCountOutput;
        oss_vertexCountOutput << "0x" << std::hex << (value->vertexCountOutput);
        contents.emplace_back("uint32_t", vertexcountoutput_prefix, oss_vertexCountOutput.str());
        std::string vertices_prefix = prefix;
        vertices_prefix += "vertices";
        std::ostringstream oss_vertices;
        oss_vertices << std::hex << reinterpret_cast<const void*>(value->vertices);
        contents.emplace_back("XrVector2f*", vertices_prefix, oss_vertices.str());
        return true;
    } catch(...) {
    }
    return false;
}